

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# devices.cpp
# Opt level: O3

bool SetDevice(char *const_id,aint ramtop)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  CDevice *pCVar4;
  size_t sVar5;
  CDeviceSlot *pCVar6;
  aint ramtop_00;
  undefined8 in_R8;
  char *pcVar7;
  CDevice **dev;
  CDevice *parent;
  long lVar8;
  char *id;
  char buf [2048];
  char *local_840;
  char local_838 [2056];
  
  if (const_id != (char *)0x0) {
    local_840 = const_id;
    iVar3 = cmphstr(&local_840,"none",false);
    if (iVar3 == 0) {
      if ((DeviceID == (char *)0x0) || (iVar3 = strcmp(DeviceID,local_840), iVar3 != 0)) {
        pcVar7 = local_840;
        pCVar4 = Devices;
        ramtop_00 = (aint)in_R8;
        DeviceID = (char *)0x0;
        dev = &Devices;
        if (Devices == (CDevice *)0x0) {
          parent = (CDevice *)0x0;
LAB_0010a98f:
          iVar3 = cmphstr(&local_840,"zxspectrum48",false);
          if (iVar3 == 0) {
            iVar3 = cmphstr(&local_840,"zxspectrum128",false);
            if (iVar3 == 0) {
              iVar3 = cmphstr(&local_840,"zxspectrum256",false);
              if (iVar3 == 0) {
                iVar3 = cmphstr(&local_840,"zxspectrum512",false);
                if (iVar3 == 0) {
                  iVar3 = cmphstr(&local_840,"zxspectrum1024",false);
                  if (iVar3 == 0) {
                    iVar3 = cmphstr(&local_840,"zxspectrum2048",false);
                    if (iVar3 == 0) {
                      iVar3 = cmphstr(&local_840,"zxspectrum4096",false);
                      if (iVar3 == 0) {
                        iVar3 = cmphstr(&local_840,"zxspectrum8192",false);
                        if (iVar3 == 0) {
                          iVar3 = cmphstr(&local_840,"zxspectrumnext",false);
                          if (iVar3 == 0) {
                            iVar3 = cmphstr(&local_840,"noslot64k",false);
                            if (iVar3 == 0) {
                              iVar3 = cmphstr(&local_840,"amstradcpc464",false);
                              if (iVar3 == 0) {
                                iVar3 = cmphstr(&local_840,"amstradcpc6128",false);
                                if (iVar3 == 0) {
                                  iVar3 = cmphstr(&local_840,"amstradcpcplus",false);
                                  if (iVar3 == 0) {
                                    bVar2 = SetUserDefinedDevice(local_840,dev,parent,ramtop);
                                    if (!bVar2) {
                                      return false;
                                    }
                                  }
                                  else {
                                    DeviceAmstradCPCPLUS(dev,parent,ramtop);
                                  }
                                }
                                else {
                                  DeviceAmstradCPC6128(dev,parent,ramtop);
                                }
                              }
                              else {
                                DeviceAmstradCPC464(dev,parent,ramtop);
                              }
                            }
                            else {
                              DeviceNoSlot64k(dev,parent,ramtop);
                            }
                          }
                          else {
                            DeviceZxSpectrumNext(dev,parent,ramtop);
                          }
                        }
                        else {
                          DeviceZXSpectrum8192(dev,parent,ramtop);
                        }
                      }
                      else {
                        DeviceZXSpectrum4096(dev,parent,ramtop);
                      }
                    }
                    else {
                      DeviceZXSpectrum2048(dev,parent,ramtop);
                    }
                  }
                  else {
                    DeviceZXSpectrum1024(dev,parent,ramtop);
                  }
                }
                else {
                  DeviceZXSpectrum512(dev,parent,ramtop);
                }
              }
              else {
                DeviceZXSpectrum256(dev,parent,ramtop);
              }
            }
            else {
              DeviceZXSpectrum128(dev,parent,ramtop);
            }
          }
          else {
            pCVar4 = (CDevice *)operator_new(0x2838);
            pCVar4->Next = (CDevice *)0x0;
            pCVar4->SlotsCount = 0;
            pCVar4->PagesCount = 0;
            pCVar4->Memory = (byte *)0x0;
            pCVar4->ZxRamTop = 0;
            pCVar4->CurrentSlot = 0;
            pCVar4->previousSlotI = 0;
            pCVar4->previousSlotOpt = O_NONE;
            pCVar4->limitExceeded = false;
            pcVar7 = strdup("ZXSPECTRUM48");
            pCVar4->ID = pcVar7;
            if (parent != (CDevice *)0x0) {
              parent->Next = pCVar4;
            }
            memset(pCVar4->Slots,0,0x2800);
            *dev = pCVar4;
            initZxLikeDevice(pCVar4,4,0x160630,(int *)(ulong)(uint)ramtop,ramtop_00);
          }
        }
        else {
          iVar3 = strcmp(Devices->ID,local_840);
          if (iVar3 == 0) {
            dev = &Devices;
          }
          else {
            do {
              parent = pCVar4;
              ramtop_00 = (aint)in_R8;
              pCVar4 = parent->Next;
              if (pCVar4 == (CDevice *)0x0) {
                dev = &parent->Next;
                goto LAB_0010a98f;
              }
              iVar3 = strcmp(pCVar4->ID,pcVar7);
            } while (iVar3 != 0);
            dev = &parent->Next;
          }
        }
        Device = *dev;
        DeviceID = Device->ID;
        CDevice::CheckPage(Device,CHECK_RESET);
      }
      if ((ramtop != 0) && (Device->ZxRamTop != ramtop && Device->ZxRamTop != 0)) {
        WarningById(W_DEV_RAMTOP,(char *)0x0,W_PASS3);
      }
      bVar2 = IsSldExportActive();
      pCVar4 = Device;
      if (bVar2) {
        pCVar6 = Device->Slots[Device->CurrentSlot];
        if (pCVar6 == (CDeviceSlot *)0x0) {
          Error("Wrong slot number",lp,PASS3);
          pCVar6 = pCVar4->Slots[0];
        }
        uVar1 = Device->SlotsCount;
        snprintf(local_838,0x800,"pages.size:%d,pages.count:%d,slots.count:%d",
                 (ulong)(uint)pCVar6->Size,(ulong)(uint)Device->PagesCount,(ulong)uVar1);
        if (0 < (long)(int)uVar1) {
          lVar8 = 0;
          do {
            sVar5 = strlen(local_838);
            pCVar4 = Device;
            pcVar7 = ",%d";
            if (lVar8 == 0) {
              pcVar7 = ",slots.adr:%d";
            }
            pCVar6 = Device->Slots[lVar8];
            if (pCVar6 == (CDeviceSlot *)0x0) {
              Error("Wrong slot number",lp,PASS3);
              pCVar6 = pCVar4->Slots[0];
            }
            snprintf(local_838 + sVar5,0x800 - sVar5,pcVar7,(ulong)(uint)pCVar6->Address);
            lVar8 = lVar8 + 1;
          } while ((int)uVar1 != lVar8);
        }
        WriteToSldFile(-1,-1,'Z',local_838);
        return true;
      }
      return true;
    }
  }
  DeviceID = (char *)0x0;
  Device = (CDevice *)0x0;
  return true;
}

Assistant:

bool SetDevice(const char *const_id, const aint ramtop) {
	CDevice** dev;
	CDevice* parent = nullptr;
	char* id = const_cast<char*>(const_id);		//TODO cmphstr for both const/nonconst variants?
		// ^ argument is const because of lua bindings

	if (!id || cmphstr(id, "none")) {
		DeviceID = nullptr;
		Device = nullptr;
		return true;
	}

	if (!DeviceID || strcmp(DeviceID, id)) {	// different device than current, change to it
		DeviceID = nullptr;
		dev = &Devices;
		// search for device
		while (*dev) {
			parent = *dev;
			if (!strcmp(parent->ID, id)) break;
			dev = &(parent->Next);
		}
		if (nullptr == (*dev)) {	// device not found
			if (cmphstr(id, "zxspectrum48")) {			// must be lowercase to catch both cases
				DeviceZXSpectrum48(dev, parent, ramtop);
			} else if (cmphstr(id, "zxspectrum128")) {
				DeviceZXSpectrum128(dev, parent, ramtop);
			} else if (cmphstr(id, "zxspectrum256")) {
				DeviceZXSpectrum256(dev, parent, ramtop);
			} else if (cmphstr(id, "zxspectrum512")) {
				DeviceZXSpectrum512(dev, parent, ramtop);
			} else if (cmphstr(id, "zxspectrum1024")) {
				DeviceZXSpectrum1024(dev, parent, ramtop);
			} else if (cmphstr(id, "zxspectrum2048")) {
				DeviceZXSpectrum2048(dev, parent, ramtop);
			} else if (cmphstr(id, "zxspectrum4096")) {
				DeviceZXSpectrum4096(dev, parent, ramtop);
			} else if (cmphstr(id, "zxspectrum8192")) {
				DeviceZXSpectrum8192(dev, parent, ramtop);
			} else if (cmphstr(id, "zxspectrumnext")) {
				DeviceZxSpectrumNext(dev, parent, ramtop);
			} else if (cmphstr(id, "noslot64k")) {
				DeviceNoSlot64k(dev, parent, ramtop);
			} else if (cmphstr(id, "amstradcpc464")) {
				DeviceAmstradCPC464(dev, parent, ramtop);
			} else if (cmphstr(id, "amstradcpc6128")) {
				DeviceAmstradCPC6128(dev, parent, ramtop);
			} else if (cmphstr(id, "amstradcpcplus")) {
				DeviceAmstradCPCPLUS(dev, parent, ramtop);
			} else if (!SetUserDefinedDevice(id, dev, parent, ramtop)) {
				return false;
			}
		}
		// set up the found/new device
		Device = (*dev);
		DeviceID = Device->ID;
		Device->CheckPage(CDevice::CHECK_RESET);
	}
	if (ramtop && Device->ZxRamTop && ramtop != Device->ZxRamTop) {
		WarningById(W_DEV_RAMTOP);
	}
	if (IsSldExportActive()) {
		// SLD tracing data are being exported, export the device data
		int pageSize = Device->GetCurrentSlot()->Size;
		int pageCount = Device->PagesCount;
		int slotsCount = Device->SlotsCount;
		char buf[LINEMAX];
		snprintf(buf, LINEMAX, "pages.size:%d,pages.count:%d,slots.count:%d",
			pageSize, pageCount, slotsCount
		);
		for (int slotI = 0; slotI < slotsCount; ++slotI) {
			size_t bufLen = strlen(buf);
			char* bufAppend = buf + bufLen;
			snprintf(bufAppend, LINEMAX-bufLen,
						(0 == slotI) ? ",slots.adr:%d" : ",%d",
						Device->GetSlot(slotI)->Address);
		}
		// pagesize
		WriteToSldFile(-1,-1,'Z',buf);
	}
	return true;
}